

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser.cc
# Opt level: O2

int ctemplate_htmlparser::htmlparser_is_url_start(htmlparser_ctx *ctx)

{
  char cVar1;
  int iVar2;
  meta_redirect_type_enum mVar3;
  char *value;
  
  iVar2 = htmlparser_attr_type(ctx);
  if (iVar2 == 2) {
    cVar1 = ctx->tag[0];
    htmlparser_attr(ctx);
    if ((cVar1 != '\0') && (iVar2 = strcmp(ctx->tag,"meta"), iVar2 == 0)) {
      value = htmlparser_value(ctx);
      mVar3 = meta_redirect_type(value);
      if (mVar3 == META_REDIRECT_TYPE_URL_START) {
        return 1;
      }
    }
    iVar2 = htmlparser_value_index(ctx);
    if (iVar2 == 0) {
      return 1;
    }
  }
  return 0;
}

Assistant:

int htmlparser_is_url_start(htmlparser_ctx *ctx)
{
  if (htmlparser_attr_type(ctx) == HTMLPARSER_ATTR_URI) {
    const char* tag = htmlparser_tag(ctx);
    /*const char* attr =*/ htmlparser_attr(ctx);

    if ((tag && strcmp(tag, "meta") == 0 &&
         meta_redirect_type(htmlparser_value(ctx)) ==
         META_REDIRECT_TYPE_URL_START) ||
        htmlparser_value_index(ctx) == 0)
      return 1;

  }
  return 0;
}